

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_product.hpp
# Opt level: O0

void __thiscall
ranges::
cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>
::cursor<false>::next_(cursor<false> *this)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<reverse_view<ref_view<vector<double,_allocator<double>_>_>_>,_ref_view<vector<char,_allocator<char>_>_>_>_>
  *r;
  mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
  local_30;
  _result_t<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>_&> last;
  __tuple_element_t<0UL,_tuple<basic_iterator<reverse_cursor<__normal_iterator<double_*,_vector<double,_allocator<double>_>_>_>_>,___normal_iterator<char_*,_vector<char,_allocator<char>_>_>_>_>
  *i;
  __tuple_element_t<0UL,_tuple<reverse_view<ref_view<vector<double,_allocator<double>_>_>_>,_ref_view<vector<char,_allocator<char>_>_>_>_>
  *v;
  cursor<false> *this_local;
  
  r = std::
      get<0ul,ranges::reverse_view<ranges::ref_view<std::vector<double,std::allocator<double>>>>,ranges::ref_view<std::vector<char,std::allocator<char>>>>
                (&this->view_->views_);
  last.
  super_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void>
  .
  super_mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
  .
  super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
  .
  super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
  .value.it_._M_current =
       (iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
        )std::
         get<0ul,ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>>,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                   (&this->its_);
  local_30.
  super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
  .
  super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
  .value.it_._M_current =
       (basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
        )_end_::fn::
         operator()<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>_&>
                   ((fn *)&_::end,r);
  bVar1 = operator!=<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ((basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
                      *)last.
                        super_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
                        .
                        super_readable_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void>
                        .
                        super_mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
                        .
                        super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
                        .
                        super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
                        .value.it_._M_current,
                     (basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
                      *)&local_30);
  if (!bVar1) {
    __assert_fail("i != last",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/furkankirac[P]cs321-2020-21-fall/range-v3/include/range/v3/view/cartesian_product.hpp"
                  ,0xa2,
                  "void ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>>>, ranges::ref_view<std::vector<char>>>::cursor<false>::next_(meta::size_t<1>) [Views = <ranges::reverse_view<ranges::ref_view<std::vector<double>>>, ranges::ref_view<std::vector<char>>>, IsConst_ = false]"
                 );
  }
  basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator++((basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
                *)last.
                  super_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
                  .
                  super_readable_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void>
                  .
                  super_mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
                  .
                  super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
                  .
                  super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
                  .value.it_._M_current);
  return;
}

Assistant:

void next_(meta::size_t<1>)
            {
                auto & v = std::get<0>(view_->views_);
                auto & i = std::get<0>(its_);
                auto const last = ranges::end(v);
                RANGES_EXPECT(i != last);
                ++i;
            }